

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address_tests.cpp
# Opt level: O0

void __thiscall IpAddressTests_ToFromString_Test::TestBody(IpAddressTests_ToFromString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  address *address_00;
  AssertHelper local_148;
  Message local_140;
  AssertHelper local_138;
  Message local_130;
  int local_128 [2];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  int local_100 [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  int local_d8 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  int local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  string local_90;
  storage_type local_70;
  uint local_6c;
  address address;
  Message local_60 [3];
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  string string;
  address addr;
  IpAddressTests_ToFromString_Test *this_local;
  
  ip::address::address((address *)(string.field_2._M_local_buf + 0xc),0xc6,'\x01','\0','\v');
  ip::to_string_abi_cxx11_
            ((string *)&gtest_ar.message_,(ip *)(string.field_2._M_local_buf + 0xc),address_00);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[11]>
            ((EqHelper<false> *)local_48,"string","\"198.1.0.11\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [11])"198.1.0.11");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&address,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&address,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address);
    testing::Message::~Message(local_60);
  }
  local_6c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (local_6c == 0) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"127.192.37.1",
                   (allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
        local_70._M_elems = (_Type)ip::from_string(&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
        poVar3 = std::operator<<((ostream *)&std::cout,"Read ip address: ");
        poVar3 = ip::operator<<(poVar3,(address *)&local_70);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_b0[1] = 0;
        pvVar4 = ip::address::operator[]((address *)&local_70,local_b0 + 1);
        local_b0[0] = 0x7f;
        testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                  ((EqHelper<false> *)local_a8,"address[0]","127",pvVar4,local_b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
        if (!bVar1) {
          testing::Message::Message(&local_b8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x31,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
        local_d8[1] = 1;
        pvVar4 = ip::address::operator[]((address *)&local_70,local_d8 + 1);
        local_d8[0] = 0xc0;
        testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                  ((EqHelper<false> *)local_d0,"address[1]","192",pvVar4,local_d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
        if (!bVar1) {
          testing::Message::Message(&local_e0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x32,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
        local_100[1] = 2;
        pvVar4 = ip::address::operator[]((address *)&local_70,local_100 + 1);
        local_100[0] = 0x25;
        testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                  ((EqHelper<false> *)local_f8,"address[2]","37",pvVar4,local_100);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_108);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x33,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_108);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_108);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        local_128[1] = 3;
        pvVar4 = ip::address::operator[]((address *)&local_70,local_128 + 1);
        local_128[0] = 1;
        testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                  ((EqHelper<false> *)local_120,"address[3]","1",pvVar4,local_128);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar1) {
          testing::Message::Message(&local_130);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
          testing::internal::AssertHelper::AssertHelper
                    (&local_138,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x34,pcVar2);
          testing::internal::AssertHelper::operator=(&local_138,&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_138);
          testing::Message::~Message(&local_130);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      }
    }
    else {
      testing::Message::Message(&local_140);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                 ,0x36,
                 "Expected: { ip::address address = ip::from_string(\"127.192.37.1\"); std::cout << \"Read ip address: \" << address << std::endl; switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[0])) == 1)>::Compare(\"address[0]\", \"127\", address[0], 127))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp\", 49, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[1])) == 1)>::Compare(\"address[1]\", \"192\", address[1], 192))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp\", 50, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[2])) == 1)>::Compare(\"address[2]\", \"37\", address[2], 37))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp\", 51, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[3])) == 1)>::Compare(\"address[3]\", \"1\", address[3], 1))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-c..." /* TRUNCATED STRING LITERAL */
                );
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message(&local_140);
    }
    local_6c = 0;
  }
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(IpAddressTests, ToFromString)
{
    // to string
    const ip::address addr = { 198, 1, 0, 11 };
    auto string = ip::to_string(addr);
    ASSERT_EQ(string, "198.1.0.11");

    // from string
    EXPECT_NO_THROW(
        {
            ip::address address = ip::from_string("127.192.37.1");
            std::cout << "Read ip address: " << address << std::endl;
            EXPECT_EQ(address[0], 127);
            EXPECT_EQ(address[1], 192);
            EXPECT_EQ(address[2], 37);
            EXPECT_EQ(address[3], 1);
        }
    );
}